

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest2.cpp
# Opt level: O2

void __thiscall TcpSocketTest::test1(TcpSocketTest *this)

{
  int iVar1;
  Address server_addr;
  timespec local_3f8;
  timespec t;
  ServerSocket server;
  ServerSocket server2;
  Socket sock;
  Selector s;
  
  this->no_echo = true;
  Selector::Selector(&s,"TcpSelector");
  JetHead::Socket::Socket(&sock,true);
  JetHead::ServerSocket::ServerSocket(&server,true);
  JetHead::ServerSocket::ServerSocket(&server2,true);
  server_addr.mAddr.sin_family = 2;
  server_addr.mAddr.sin_port = 0;
  server_addr.mAddr.sin_addr.s_addr = 0;
  server_addr.mLen = 0x10;
  iVar1 = JetHead::ServerSocket::bind((Address *)&server);
  if (iVar1 == -1) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x180,"Bind Failed.");
  }
  iVar1 = JetHead::ServerSocket::listen((int)&server);
  if (iVar1 < 0) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/SocketTest2.cpp"
               ,0x188,"ListenFailed");
  }
  JetHead::Socket::getLocalAddress((Address *)&server);
  JetHead::Socket::Address::setAddress((char *)&server_addr);
  JetHead::Socket::setSelector((SocketListener *)&server,(Selector *)&this->super_SocketListener);
  local_3f8.tv_sec = 0;
  local_3f8.tv_nsec = 0;
  t.tv_sec = 0;
  t.tv_nsec = 10000000;
  nanosleep((timespec *)&t,&local_3f8);
  this->no_echo = false;
  JetHead::ServerSocket::~ServerSocket(&server2);
  JetHead::ServerSocket::~ServerSocket(&server);
  JetHead::Socket::~Socket(&sock);
  Selector::~Selector(&s);
  return;
}

Assistant:

void TcpSocketTest::test1()
{

  no_echo = true;
  Selector s( "TcpSelector" );
  Socket sock;
  ServerSocket server;
  ServerSocket server2;
  Socket::Address server_addr, server_addr2, client_addr;
  int res;
  char buf[BUF_SIZE];
  for( int i = 0; i < BUF_SIZE; i++)
    buf[i] = 'A';
  
  
  
  // This crashes the program. 
  // res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //TestFailed("Writing no where should fail");
  
  
  
  res = server.bind(server_addr);
  if( res == -1 )
    TestFailed("Bind Failed.");
  
  // res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //TestFailed("Writing no where should fail");
  
  res = server.listen(1);
  if ( res < 0 )
    TestFailed("ListenFailed");
  
  //res = server.write(buf, BUF_SIZE);
  //if( res != -1 )
  //  TestFailed("Writing no where should fail");
  
  res = server.getLocalAddress( server_addr );
  server_addr.setAddress( "127.0.0.1" );
  
  // UNCOMMENT TO PALY ECHO cerr << "Server name " <<  server_addr.getName() << " "<<  server_addr.getPort() << endl;
  
  server.setSelector( this, mSelector );

  //res = sock.connect( server_addr );
  //cout << "In echo mode." << endl;
  
  struct timespec t,tt;
  t.tv_sec = tt.tv_sec = tt.tv_nsec = 0;
  t.tv_nsec = 10000000;
  res = nanosleep( &t, &tt );
 
  
  
  no_echo = false;
  //cout << "Out of echo mode." << endl;

    
}